

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

void sexp_set_twos_complement(sexp_conflict a)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (a->value).promise.donep;
  for (uVar3 = (ulong)uVar2; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    puVar1 = (ulong *)((long)&a->value + uVar3 * 8 + 8);
    *puVar1 = ~*puVar1;
  }
  uVar3 = 1;
  uVar4 = uVar3;
  do {
    puVar1 = (ulong *)((long)&a->value + uVar3 * 8 + 8);
    bVar5 = CARRY8(*puVar1,uVar4);
    *puVar1 = *puVar1 + uVar4;
    if ((long)(int)uVar2 <= (long)uVar3) {
      return;
    }
    uVar4 = (ulong)bVar5;
    uVar3 = uVar3 + 1;
  } while (bVar5);
  return;
}

Assistant:

static void sexp_set_twos_complement (sexp a) {
  int i, len=sexp_bignum_length(a), carry = 1;
  sexp_uint_t* data = sexp_bignum_data(a), n;
  for (i=len-1; i >=0; --i)
    data[i] = ~data[i];
  /* sexp_bignum_fxadd with no final carry */
  i = 0;
  do { n = data[i];
       data[i] += carry;
       carry = (n > (SEXP_UINT_T_MAX - carry));
  } while (++i<len && carry);
}